

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,char *split_categ,
                        MissingAction missing_action,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  size_t row;
  ulong uVar2;
  size_t sVar3;
  
  if (missing_action != Fail) {
    uVar2 = st;
    if (st <= end) {
      do {
        if ((-1 < (long)x[ix_arr[uVar2]]) && (split_categ[x[ix_arr[uVar2]]] == '\x01')) {
          sVar3 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar2];
          ix_arr[uVar2] = sVar3;
          st = st + 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 <= end);
    }
    *st_NA = st;
    uVar2 = st;
    for (; st <= end; st = st + 1) {
      if (x[ix_arr[st]] < 0) {
        sVar3 = ix_arr[uVar2];
        ix_arr[uVar2] = ix_arr[st];
        ix_arr[st] = sVar3;
        uVar2 = uVar2 + 1;
      }
    }
    *end_NA = uVar2;
    return;
  }
  sVar3 = st;
  if (st <= end) {
    do {
      if (split_categ[x[ix_arr[st]]] == '\x01') {
        sVar1 = ix_arr[sVar3];
        ix_arr[sVar3] = ix_arr[st];
        ix_arr[st] = sVar1;
        sVar3 = sVar3 + 1;
      }
      st = st + 1;
    } while (st <= end);
  }
  *split_ix = sVar3;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end, signed char split_categ[],
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail)
    {
        /* move to the left if it's l.e. than the split point */
        for (size_t row = st; row <= end; row++)
        {
            if (split_categ[ x[ix_arr[row]] ] == 1)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        split_ix = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        for (size_t row = st; row <= end; row++)
        {
            if (x[ix_arr[row]] >= 0 && split_categ[ x[ix_arr[row]] ] == 1)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        st_NA = st;

        for (size_t row = st; row <= end; row++)
        {
            if (x[ix_arr[row]] < 0)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        end_NA = st;
    }
}